

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O2

void __thiscall BMP::writeFrequency(BMP *this,ofstream *out)

{
  ostream *poVar1;
  long lVar2;
  GreyCount *pGVar3;
  GreyCount local_a8;
  
  if (out == (ofstream *)0x0) {
    out = (ofstream *)&std::cout;
  }
  pGVar3 = this->alphabet->symbol;
  for (lVar2 = (long)this->alphabet->num << 7; lVar2 != 0; lVar2 = lVar2 + -0x80) {
    bitMap::GreyCount::GreyCount(&local_a8,pGVar3);
    *(undefined8 *)((ostream *)out + *(long *)(*(long *)out + -0x18) + 0x10) = 8;
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)out,(uint)local_a8.tone);
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    bitMap::GreyCount::~GreyCount(&local_a8);
    pGVar3 = pGVar3 + 1;
  }
  return;
}

Assistant:

void BMP::writeFrequency( std::ofstream *out )
{
    using namespace std;
    bool flag;
    if ( out != nullptr ) {
        flag = true;
    } else {
        flag = false;
    }

    for_each(alphabet->symbol, alphabet->symbol+alphabet->num, [ & ]( bitMap::GreyCount a ){
        if ( flag ) {
            (*out) << setw( 8 ) << ( int ) a.tone << ": " << a.num << endl;
        } else {
            cout << setw( 8 ) << ( int ) a.tone << ": " << a.num << endl;
        }
    });
}